

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *
parseV5EntryFormat(Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>
                   *__return_storage_ptr__,DWARFDataExtractor *DebugLineData,uint64_t *OffsetPtr,
                  uint64_t EndPrologueOffset,ContentTypeTracker *ContentTypes)

{
  uint *puVar1;
  AlignedCharArrayUnion<(anonymous_namespace)::ContentDescriptor> AVar2;
  byte bVar3;
  uint uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ContentTypeTracker *pCVar7;
  char *pcVar8;
  char acVar9 [8];
  int iVar10;
  Error *Err;
  long *plVar11;
  uint uVar12;
  ulong uVar13;
  error_code EC;
  error_code EC_00;
  Error local_a8;
  Error local_a0;
  ContentTypeTracker *local_98;
  ContentTypeTracker *local_90;
  ContentTypeTracker *local_88;
  uint64_t local_80;
  uint64_t EndPrologueOffset_local;
  ContentTypeTracker *local_70;
  undefined1 local_68 [8];
  ContentDescriptors Descriptors;
  
  local_68 = (undefined1  [8])
             &Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
              super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
              super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
              super_SmallVectorBase.Size;
  Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
  super_SmallVectorBase.BeginX = (void *)0x400000000;
  local_80 = EndPrologueOffset;
  EndPrologueOffset_local = (uint64_t)DebugLineData;
  local_70 = ContentTypes;
  Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.InlineElts[3].
  buffer = (char  [8])__return_storage_ptr__;
  bVar3 = llvm::DataExtractor::getU8(&DebugLineData->super_DataExtractor,OffsetPtr,(Error *)0x0);
  if (bVar3 != 0) {
    uVar12 = (uint)bVar3;
    local_88 = (ContentTypeTracker *)&local_70->HasSource;
    local_98 = (ContentTypeTracker *)&local_70->HasMD5;
    local_90 = (ContentTypeTracker *)&local_70->HasLength;
    uVar13 = 0;
    do {
      if (local_80 <= *OffsetPtr) {
        pcVar8 = (char *)std::_V2::generic_category();
        EC._M_cat = (error_category *)0x16;
        EC._0_8_ = &local_a8;
        llvm::createStringError<unsigned_long,unsigned_long>
                  (EC,pcVar8,
                   (unsigned_long *)
                   "failed to parse entry content descriptions at offset 0x%8.8lx because offset extends beyond the prologue end at offset 0x%8.8lx"
                   ,OffsetPtr);
        Err = &local_a8;
        goto LAB_00b01a58;
      }
      uVar5 = llvm::DataExtractor::getULEB128
                        ((DataExtractor *)EndPrologueOffset_local,OffsetPtr,(Error *)0x0);
      uVar6 = llvm::DataExtractor::getULEB128
                        ((DataExtractor *)EndPrologueOffset_local,OffsetPtr,(Error *)0x0);
      iVar10 = (int)uVar5;
      uVar13 = uVar13 & 0xff;
      if (iVar10 == 1) {
        uVar13 = uVar5 & 0xffffffff;
      }
      if (local_70 != (ContentTypeTracker *)0x0) {
        if (iVar10 < 5) {
          pCVar7 = local_70;
          if ((iVar10 == 3) || (pCVar7 = local_90, iVar10 == 4)) {
LAB_00b01940:
            pCVar7->HasModTime = true;
          }
        }
        else {
          pCVar7 = local_98;
          if ((iVar10 == 5) || (pCVar7 = local_88, iVar10 == 0x2001)) goto LAB_00b01940;
        }
      }
      if (Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
          super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
          super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
          super_SmallVectorBase.BeginX._4_4_ <=
          (uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                super_SmallVectorBase.BeginX) {
        llvm::SmallVectorBase::grow_pod
                  ((SmallVectorBase *)local_68,
                   &Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                    super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                    super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                    super_SmallVectorBase.Size,0,8);
      }
      *(uint64_t *)
       ((long)local_68 +
       ((ulong)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
               super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
               super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
               super_SmallVectorBase.BeginX & 0xffffffff) * 2 * 4) =
           uVar5 & 0xffffffff | (uVar6 & 0xffff) << 0x20;
      if (Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
          super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
          super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
          super_SmallVectorBase.BeginX._4_4_ <=
          (uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                super_SmallVectorBase.BeginX) goto LAB_00b01ae7;
      uVar4 = (uint)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                    super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                    super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                    super_SmallVectorBase.BeginX + 1;
      Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
      super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
      super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
      super_SmallVectorBase.BeginX =
           (void *)CONCAT44(Descriptors.
                            super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                            super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>
                            .
                            super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                            .super_SmallVectorBase.BeginX._4_4_,uVar4);
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
    if ((uVar13 & 1) != 0) {
      *(byte *)((long)Descriptors.
                      super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                      InlineElts[3].buffer + 0x30) =
           *(byte *)((long)Descriptors.
                           super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                           InlineElts[3].buffer + 0x30) & 0xfe;
      *(void **)Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                InlineElts[3].buffer =
           (void *)((long)Descriptors.
                          super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                          InlineElts[3].buffer + 0x10);
      *(undefined8 *)
       ((long)Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
              InlineElts[3].buffer + 8) = 0x400000000;
      puVar1 = &Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
                super_SmallVectorBase.Size;
      if ((char  [8])local_68 !=
          Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
          InlineElts[3].buffer && uVar4 != 0) {
        if (local_68 == (undefined1  [8])puVar1) {
          if (4 < uVar4) {
            *(undefined4 *)
             ((long)Descriptors.
                    super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                    InlineElts[3].buffer + 8) = 0;
            llvm::SmallVectorBase::grow_pod
                      ((SmallVectorBase *)
                       Descriptors.
                       super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                       InlineElts[3].buffer,
                       (void *)((long)Descriptors.
                                      super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>
                                      .InlineElts[3].buffer + 0x10),(ulong)uVar4,8);
          }
          AVar2.buffer = Descriptors.
                         super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                         InlineElts[3].buffer;
          if (((ulong)Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                      super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
                      super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                      .super_SmallVectorBase.BeginX & 0xffffffff) != 0) {
            memcpy(*(void **)Descriptors.
                             super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                             InlineElts[3].buffer,(void *)local_68,
                   ((ulong)Descriptors.
                           super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                           super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>
                           .
                           super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                           .super_SmallVectorBase.BeginX & 0xffffffff) << 3);
          }
          if (*(uint *)((long)AVar2.buffer + 0xc) < uVar4) {
LAB_00b01ae7:
            __assert_fail("N <= capacity()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                          ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
          }
          *(uint *)((long)AVar2.buffer + 8) = uVar4;
          Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
          super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
          super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
          super_SmallVectorBase.BeginX =
               (void *)((ulong)Descriptors.
                               super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
                               super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>
                               .
                               super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>
                               .super_SmallVectorBase.BeginX & 0xffffffff00000000);
        }
        else {
          *(undefined1 (*) [8])
           Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
           InlineElts[3].buffer = local_68;
          *(uint *)((long)Descriptors.
                          super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                          InlineElts[3].buffer + 8) = uVar4;
          *(uint *)((long)Descriptors.
                          super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
                          InlineElts[3].buffer + 0xc) =
               Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
               super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
               super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
               super_SmallVectorBase.BeginX._4_4_;
          Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
          super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
          super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
          super_SmallVectorBase.BeginX = (void *)0x0;
          local_68 = (undefined1  [8])puVar1;
        }
      }
      goto LAB_00b01a77;
    }
  }
  pcVar8 = (char *)std::_V2::generic_category();
  EC_00._M_cat = (error_category *)0x16;
  EC_00._0_8_ = &local_a0;
  llvm::createStringError(EC_00,pcVar8);
  Err = &local_a0;
LAB_00b01a58:
  llvm::Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::Expected
            ((Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)
             Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
             InlineElts[3].buffer,Err);
  plVar11 = (long *)((ulong)Err->Payload & 0xfffffffffffffffe);
  if (plVar11 != (long *)0x0) {
    (**(code **)(*plVar11 + 8))();
  }
LAB_00b01a77:
  if (local_68 !=
      (undefined1  [8])
      &Descriptors.super_SmallVectorImpl<(anonymous_namespace)::ContentDescriptor>.
       super_SmallVectorTemplateBase<(anonymous_namespace)::ContentDescriptor,_true>.
       super_SmallVectorTemplateCommon<(anonymous_namespace)::ContentDescriptor,_void>.
       super_SmallVectorBase.Size) {
    free((void *)local_68);
  }
  acVar9[0] = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
              InlineElts[3].buffer[0];
  acVar9[1] = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
              InlineElts[3].buffer[1];
  acVar9[2] = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
              InlineElts[3].buffer[2];
  acVar9[3] = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
              InlineElts[3].buffer[3];
  acVar9[4] = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
              InlineElts[3].buffer[4];
  acVar9[5] = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
              InlineElts[3].buffer[5];
  acVar9[6] = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
              InlineElts[3].buffer[6];
  acVar9[7] = Descriptors.super_SmallVectorStorage<(anonymous_namespace)::ContentDescriptor,_4U>.
              InlineElts[3].buffer[7];
  return (Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *)acVar9;
}

Assistant:

static llvm::Expected<ContentDescriptors>
parseV5EntryFormat(const DWARFDataExtractor &DebugLineData, uint64_t *OffsetPtr,
                   uint64_t EndPrologueOffset,
                   DWARFDebugLine::ContentTypeTracker *ContentTypes) {
  ContentDescriptors Descriptors;
  int FormatCount = DebugLineData.getU8(OffsetPtr);
  bool HasPath = false;
  for (int I = 0; I != FormatCount; ++I) {
    if (*OffsetPtr >= EndPrologueOffset)
      return createStringError(
          errc::invalid_argument,
          "failed to parse entry content descriptions at offset "
          "0x%8.8" PRIx64
          " because offset extends beyond the prologue end at offset "
          "0x%8.8" PRIx64,
          *OffsetPtr, EndPrologueOffset);
    ContentDescriptor Descriptor;
    Descriptor.Type =
      dwarf::LineNumberEntryFormat(DebugLineData.getULEB128(OffsetPtr));
    Descriptor.Form = dwarf::Form(DebugLineData.getULEB128(OffsetPtr));
    if (Descriptor.Type == dwarf::DW_LNCT_path)
      HasPath = true;
    if (ContentTypes)
      ContentTypes->trackContentType(Descriptor.Type);
    Descriptors.push_back(Descriptor);
  }

  if (!HasPath)
    return createStringError(errc::invalid_argument,
                             "failed to parse entry content descriptions"
                             " because no path was found");
  return Descriptors;
}